

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         write_significand<char,fmt::v10::appender,char_const*,fmt::v10::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int exponent,
                   digit_grouping<char> *grouping)

{
  basic_string_view<char> digits;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar1;
  char local_239;
  buffer<char> local_238;
  char local_218 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    buffer<char>::append<char>
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,significand
               ,significand + significand_size);
    local_238._vptr_buffer = (_func_int **)CONCAT71(local_238._vptr_buffer._1_7_,0x30);
    bVar1.container = (buffer<char> *)fill_n<fmt::v10::appender,int,char>(out,exponent,&local_238);
  }
  else {
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_001b6c80;
    local_238.capacity_ = 500;
    local_238.ptr_ = local_218;
    buffer<char>::append<char>(&local_238,significand,significand + significand_size);
    local_239 = '0';
    fill_n<fmt::v10::appender,int,char>((appender)&local_238,exponent,&local_239);
    digits.size_ = local_238.size_;
    digits.data_ = local_238.ptr_;
    bVar1.container =
         (buffer<char> *)digit_grouping<char>::apply<fmt::v10::appender,char>(grouping,out,digits);
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_,local_238.capacity_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}